

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_BrFncNeqApply(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  FunctionProxy *this_00;
  ProxyEntryPointInfo *entryPoint;
  JavascriptMethod p_Var8;
  bool bVar9;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_009a06f1;
    *puVar7 = 0;
  }
  bVar5 = TaggedInt::Is(instance);
  bVar9 = true;
  if ((ulong)instance >> 0x32 == 0 && !bVar5) {
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_009a06f1;
      *puVar7 = 0;
    }
    TVar2 = ((this->type).ptr)->typeId;
    if ((int)TVar2 < 0x58) {
      if (TVar2 == TypeIds_Function) {
        this_00 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)instance);
        if (this_00 == (FunctionProxy *)0x0) {
          if (*(FunctionInfo **)((long)instance + 0x28) == (FunctionInfo *)0x0) goto LAB_009a06d3;
          p_Var8 = FunctionInfo::GetOriginalEntryPoint(*(FunctionInfo **)((long)instance + 0x28));
        }
        else {
          entryPoint = FunctionProxy::GetDefaultEntryPointInfo(this_00);
          p_Var8 = FunctionProxy::GetDirectEntryPoint(this_00,entryPoint);
        }
        bVar9 = p_Var8 != JavascriptFunction::EntryApply;
      }
    }
    else {
      BVar6 = RecyclableObject::IsExternal(this);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) {
LAB_009a06f1:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
    }
  }
LAB_009a06d3:
  pTVar3->noJsReentrancy = bVar1;
  return (BOOL)bVar9;
}

Assistant:

BOOL JavascriptOperators::OP_BrFncNeqApply(Var instance, ScriptContext *scriptContext)
     {
         JIT_HELPER_NOT_REENTRANT_HEADER(Op_OP_BrFncNeqApply, reentrancylock, scriptContext->GetThreadContext());
         // JavascriptFunction and !HostDispatch
         if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
         {
             FunctionProxy *bod = ((JavascriptFunction *)instance)->GetFunctionProxy();
             if (bod != nullptr)
             {
                 return bod->GetDirectEntryPoint(bod->GetDefaultEntryPointInfo()) != &Js::JavascriptFunction::EntryApply;
             }
             else
             {
                 FunctionInfo* info = ((JavascriptFunction *)instance)->GetFunctionInfo();
                 if (info != nullptr)
                 {
                     return &Js::JavascriptFunction::EntryApply != info->GetOriginalEntryPoint();
                 }
                 else
                 {
                     return true;
                 }
             }
         }

         return true;
         JIT_HELPER_END(Op_OP_BrFncNeqApply);
     }